

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall clinet::on_accept(clinet *this,int netid,int error)

{
  login_req req;
  
  if (error == 0) {
    this->netid_ = netid;
    puts(&DAT_00108262);
    req.name[0x10] = '\0';
    req.name[0x11] = '\0';
    req.name[0x12] = '\0';
    req.name[0x13] = '\0';
    req.name[0x14] = '\0';
    req.name[0x15] = '\0';
    req.name[0x16] = '\0';
    req.name[0x17] = '\0';
    req.name[0x18] = '\0';
    req.name[0x19] = '\0';
    req.name[0x1a] = '\0';
    req.name[0x1b] = '\0';
    req.name[0x1c] = '\0';
    req.name[0x1d] = '\0';
    req.name[0x1e] = '\0';
    req.name[0x1f] = '\0';
    req.name[0] = '\0';
    req.name[1] = '\0';
    req.name[2] = '\0';
    req.name[3] = '\0';
    req.name[4] = '\0';
    req.name[5] = '\0';
    req.name[6] = '\0';
    req.name[7] = '\0';
    req.name[8] = '\0';
    req.name[9] = '\0';
    req.name[10] = '\0';
    req.name[0xb] = '\0';
    req.name[0xc] = '\0';
    req.name[0xd] = '\0';
    req.name[0xe] = '\0';
    req.name[0xf] = '\0';
    printf(anon_var_dwarf_e9);
    __isoc99_scanf("%s",&req);
    send_message(this,1,&req,0x20);
    return;
  }
  __assert_fail("error == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                ,0x17,"virtual void clinet::on_accept(int, int)");
}

Assistant:

void on_accept(int netid, int error) override
    {
        assert(error == 0);
        netid_ = netid;
        printf("连接服务器成功\n");

        login_req req = { 0 };
        printf("请先给自己起个名字：");
        scanf("%s", req.name);
        send_message(MSG_LOGIN_REQ, &req, sizeof(req));
    }